

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  uint8_t uVar1;
  FileDescriptor *pFVar2;
  FileDescriptor *pFVar3;
  bool bVar4;
  
  pFVar2 = (FileDescriptor *)this->ptr_;
  uVar1 = (pFVar2->super_SymbolBase).symbol_type_;
  switch(uVar1) {
  case '\x01':
    pFVar3 = (FileDescriptor *)0x0;
    if (uVar1 == '\x01') {
      pFVar3 = pFVar2;
    }
    goto LAB_0017c770;
  case '\x02':
    bVar4 = uVar1 == '\x02';
    break;
  case '\x03':
    pFVar3 = (FileDescriptor *)0x0;
    if (uVar1 == '\x03') {
      pFVar3 = pFVar2;
    }
    pFVar3 = (FileDescriptor *)pFVar3->package_;
LAB_0017c770:
    return (FileDescriptor *)pFVar3->pool_;
  case '\x04':
    bVar4 = uVar1 == '\x04';
    break;
  case '\x05':
    pFVar3 = *(FileDescriptor **)((long)pFVar2 + (0x10 - (ulong)(uVar1 != '\x05')));
    goto LAB_0017c7b6;
  default:
    return (FileDescriptor *)0x0;
  case '\a':
    bVar4 = uVar1 == '\a';
    break;
  case '\b':
    pFVar3 = (FileDescriptor *)0x0;
    if (uVar1 == '\b') {
      pFVar3 = pFVar2;
    }
    pFVar3 = (FileDescriptor *)pFVar3->package_;
    goto LAB_0017c7b6;
  case '\t':
    pFVar3 = (FileDescriptor *)0x0;
    if (uVar1 == '\t') {
      pFVar3 = pFVar2;
    }
    return pFVar3;
  case '\n':
    pFVar3 = (FileDescriptor *)0x0;
    if (uVar1 == '\n') {
      pFVar3 = pFVar2;
    }
    return (FileDescriptor *)pFVar3->name_;
  }
  pFVar3 = (FileDescriptor *)0x0;
  if (bVar4) {
    pFVar3 = pFVar2;
  }
LAB_0017c7b6:
  return (FileDescriptor *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&pFVar3->package_)->_M_allocated_capacity;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }